

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_append_insn(MIR_context_t ctx,MIR_item_t_conflict func_item,MIR_insn_t_conflict insn)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  VARR_MIR_proto_t *pVVar4;
  VARR_MIR_var_t *pVVar5;
  MIR_var_t *pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  size_t sVar14;
  MIR_proto_t *ppMVar15;
  MIR_insn_t_conflict pMVar16;
  MIR_proto_t extraout_RAX;
  MIR_proto_t pMVar17;
  ulong uVar18;
  ulong nops;
  ulong uVar19;
  long lVar20;
  size_t extraout_RDX;
  long unaff_RBP;
  MIR_insn_code_t code;
  char *pcVar21;
  char *pcVar22;
  char *varr;
  MIR_error_type_t MVar23;
  MIR_context_t ctx_00;
  ulong uVar24;
  int unaff_R13D;
  code *pcVar25;
  ulong uVar26;
  MIR_error_func_t p_Stack_40;
  
  if (func_item == (MIR_item_t_conflict)0x0) {
    __assert_fail("func_item != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xa62,"void MIR_append_insn(MIR_context_t, MIR_item_t, MIR_insn_t)");
  }
  if (func_item->item_type == MIR_func_item) {
    DLIST_MIR_insn_t_append(&((func_item->u).func)->insns,insn);
    return;
  }
  pcVar21 = "MIR_append_insn: wrong func item";
  ctx_00 = (MIR_context_t)0xb;
  (*ctx->error_func)(MIR_wrong_param_value_error,"MIR_append_insn: wrong func item");
  code = (MIR_insn_code_t)pcVar21;
  sVar14 = insn_code_nops(ctx_00,code);
  if (ctx == (MIR_context_t)0x0 && nops != 0) {
LAB_001333d1:
    __assert_fail("nops == 0 || ops != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x890,
                  "MIR_insn_t MIR_new_insn_arr(MIR_context_t, MIR_insn_code_t, size_t, MIR_op_t *)")
    ;
  }
  if (code - MIR_SWITCH < 0xfffffffd) {
    if ((int)code < 0xb5) {
      if (code == MIR_SWITCH) goto LAB_001330e4;
      if (code != MIR_RET) goto LAB_001330c5;
    }
    else if ((code != MIR_UNSPEC) && (code != MIR_USE)) {
      if (code != MIR_PHI) {
LAB_001330c5:
        if (sVar14 != nops) goto LAB_00133527;
        goto LAB_001330ce;
      }
      goto LAB_0013317c;
    }
  }
  else {
LAB_001330ce:
    if (code == MIR_PHI) {
LAB_0013317c:
      if (nops < 3) {
        pcVar22 = "number of MIR_PHI operands is less 3";
        goto LAB_001334e9;
      }
      goto LAB_0013334f;
    }
    if (code == MIR_SWITCH) {
LAB_001330e4:
      if (nops < 2) {
        pcVar22 = "number of MIR_SWITCH operands is less 2";
        goto LAB_001334e9;
      }
      goto LAB_0013334f;
    }
  }
  if ((int)code < 0xb0) {
    if (code - MIR_CALL < 3) {
LAB_00133118:
      uVar26 = (ulong)(code != MIR_UNSPEC) + 1;
      if (nops < uVar26) goto LAB_001334e2;
      if (code != MIR_UNSPEC) {
        if ((*(char *)&ctx->c2mir_ctx != '\b') || (*(int *)(ctx->error_func + 0x20) != 1)) {
          pcVar22 = "the 1st call operand should be a prototype";
          MVar23 = MIR_call_op_error;
          goto LAB_00133522;
        }
        ppMVar15 = (MIR_proto_t *)(ctx->error_func + 0x40);
LAB_00133214:
        pMVar17 = *ppMVar15;
        uVar18 = (ulong)pMVar17->nres;
        if (pMVar17->args != (VARR_MIR_var_t *)0x0) {
          uVar18 = uVar18 + pMVar17->args->els_num;
        }
        if (nops < uVar18 + uVar26) goto LAB_001334b1;
        if ((uVar18 + uVar26 != nops) && (pMVar17->vararg_p == '\0')) goto LAB_001334b1;
        if (uVar26 < nops) {
          pcVar25 = (code *)(uVar26 * 3);
          unaff_R13D = (int)pcVar25;
          uVar18 = (ulong)(uint)(unaff_R13D << 4);
          unaff_RBP = 0;
          uVar24 = 0;
          do {
            if ((*(char *)((long)&ctx->c2mir_ctx + unaff_RBP * 2 + uVar18) == '\n') &&
               (bVar3 = *(byte *)((long)&ctx->error_func + unaff_RBP * 2 + uVar18),
               0xfffffff9 < bVar3 - 0x12)) {
              uVar19 = (ulong)pMVar17->nres;
              sVar14 = uVar24 - uVar19;
              if (uVar24 < uVar19) {
LAB_001333a7:
                pcVar22 = "call";
                if (code == MIR_UNSPEC) {
                  pcVar22 = "unspec";
                }
                varr = "result of %s is block type memory";
LAB_00133459:
                MVar23 = MIR_wrong_type_error;
                goto LAB_0013345e;
              }
              varr = (char *)pMVar17->args;
              if ((VARR_MIR_var_t *)varr == (VARR_MIR_var_t *)0x0) {
                MIR_new_insn_arr_cold_2();
                goto LAB_001333d1;
              }
              if (sVar14 < ((VARR_MIR_var_t *)varr)->els_num) {
                pMVar6 = ((VARR_MIR_var_t *)varr)->varr;
                if (pMVar6 == (MIR_var_t *)0x0) goto LAB_001334ac;
                if (*(uint *)((long)&pMVar6[-uVar19].type + unaff_RBP) != (uint)bVar3) {
                  pcVar22 = "call";
                  if (code == MIR_UNSPEC) {
                    pcVar22 = "unspec";
                  }
                  varr = "arg of %s is block type memory but param is not of block type";
                  goto LAB_00133459;
                }
                if (*(long *)((long)&pMVar6[-uVar19].size + unaff_RBP) !=
                    *(long *)((long)&ctx->unspec_protos + unaff_RBP * 2 + uVar18))
                goto LAB_00133463;
              }
              else if (bVar3 == 0x11) {
LAB_00133417:
                pcVar22 = "call";
                if (code == MIR_UNSPEC) {
                  pcVar22 = "unspec";
                }
                varr = "RBLK memory can not correspond to unnamed param in %s insn";
                goto LAB_00133459;
              }
            }
            else {
              uVar19 = (ulong)pMVar17->nres;
              if (uVar19 <= uVar24) {
                pVVar5 = pMVar17->args;
                if (pVVar5 == (VARR_MIR_var_t *)0x0) {
                  MIR_new_insn_arr_cold_4();
                  goto LAB_001333a7;
                }
                if (uVar24 - uVar19 < pVVar5->els_num) {
                  if (pVVar5->varr == (MIR_var_t *)0x0) {
                    MIR_new_insn_arr_cold_3();
                    goto LAB_00133417;
                  }
                  if (0xfffffff9 < *(int *)((long)&pVVar5->varr[-uVar19].type + unaff_RBP) - 0x12U)
                  {
                    pcVar22 = "call";
                    if (code == MIR_UNSPEC) {
                      pcVar22 = "unspec";
                    }
                    varr = "param of %s is of block type but arg is not of block type memory";
                    goto LAB_00133459;
                  }
                }
              }
            }
            uVar24 = uVar24 + 1;
            unaff_RBP = unaff_RBP + 0x18;
          } while (nops - uVar26 != uVar24);
        }
LAB_0013334f:
        pMVar16 = create_insn(ctx_00,nops,code);
        *(int *)&pMVar16->field_0x1c = (int)nops;
        if (nops != 0) {
          lVar20 = 0;
          uVar26 = nops;
          do {
            pcVar25 = (code *)((long)&ctx->gen_ctx + lVar20);
            uVar7 = *(undefined8 *)pcVar25;
            uVar8 = *(undefined8 *)(pcVar25 + 8);
            uVar9 = *(undefined8 *)(pcVar25 + 0x10);
            uVar10 = *(undefined8 *)(pcVar25 + 0x18);
            puVar1 = (undefined8 *)((long)&ctx->error_func + lVar20);
            uVar11 = puVar1[1];
            uVar12 = puVar1[2];
            uVar13 = puVar1[3];
            puVar2 = (undefined8 *)((long)&pMVar16->ops[0].u + lVar20);
            *puVar2 = *puVar1;
            puVar2[1] = uVar11;
            puVar2[2] = uVar12;
            puVar2[3] = uVar13;
            puVar1 = (undefined8 *)((long)&pMVar16->ops[0].data + lVar20);
            *puVar1 = uVar7;
            puVar1[1] = uVar8;
            puVar1[2] = uVar9;
            puVar1[3] = uVar10;
            lVar20 = lVar20 + 0x30;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
        }
        return;
      }
      if (*(char *)&ctx->c2mir_ctx != '\x03') {
LAB_001334fe:
        pcVar22 = "the 1st unspec operand should be valid unspec code";
        MVar23 = MIR_unspec_op_error;
        goto LAB_00133522;
      }
      pVVar4 = ctx_00->unspec_protos;
      if (pVVar4 == (VARR_MIR_proto_t *)0x0) {
        MIR_new_insn_arr_cold_6();
      }
      else {
        if ((MIR_error_func_t)pVVar4->els_num <= ctx->error_func) goto LAB_001334fe;
        if (pVVar4->varr != (MIR_proto_t *)0x0) {
          ppMVar15 = pVVar4->varr + (long)ctx->error_func;
          goto LAB_00133214;
        }
      }
      MIR_new_insn_arr_cold_5();
LAB_00133516:
      pcVar22 = "property should be a integer operand";
    }
    else {
LAB_001331b9:
      if (1 < code - MIR_PRBEQ) goto LAB_0013334f;
      if (*(char *)&(ctx->environment_module).items.tail != '\x03') goto LAB_00133516;
      if ((*(char *)&ctx->temp_data == '\x01') || (*(char *)&ctx->temp_data == '\n'))
      goto LAB_0013334f;
      pcVar22 = "2nd operand of property branch should be any memory or reg with given type";
    }
  }
  else {
    if (code != MIR_VA_ARG) {
      if (code != MIR_PRSET) {
        if (code != MIR_UNSPEC) goto LAB_001331b9;
        goto LAB_00133118;
      }
      if (*(char *)&ctx->temp_data == '\x03') goto LAB_0013334f;
      goto LAB_00133516;
    }
    if (*(char *)&(ctx->environment_module).items.tail == '\n') goto LAB_0013334f;
    pcVar22 = "3rd operand of va_arg should be any memory with given type";
  }
  MVar23 = MIR_op_mode_error;
LAB_00133522:
  do {
    (*ctx_00->error_func)(MVar23,pcVar22);
LAB_00133527:
    pcVar22 = insn_descs[(ulong)pcVar21 & 0xffffffff].name;
    varr = "wrong number of operands for insn %s";
    MVar23 = MIR_ops_num_error;
LAB_0013345e:
    (*ctx_00->error_func)(MVar23,varr,pcVar22);
    sVar14 = extraout_RDX;
LAB_00133463:
    pcVar25 = (code *)((long)&ctx->gen_ctx + (ulong)(uint)(unaff_R13D << 4));
    ctx = (MIR_context_t)ctx_00->error_func;
    VARR_MIR_var_tget((MIR_var_t *)&stack0xffffffffffffffb0,(VARR_MIR_var_t *)varr,sVar14);
    pcVar22 = "call";
    if (code == MIR_UNSPEC) {
      pcVar22 = "unspec";
    }
    (*(code *)ctx)(0x12,"different sizes (%lu vs %lu) of arg and param block memory in %s insn",
                   p_Stack_40,*(undefined8 *)(pcVar25 + unaff_RBP * 2 + 0x28),pcVar22);
    ctx_00 = (MIR_context_t)&stack0xffffffffffffffb0;
LAB_001334ac:
    unaff_R13D = (int)pcVar25;
    MIR_new_insn_arr_cold_1();
    pMVar17 = extraout_RAX;
LAB_001334b1:
    pcVar22 = "call";
    if (code == MIR_UNSPEC) {
      pcVar22 = "unspec";
    }
    (*ctx_00->error_func)
              (code == MIR_UNSPEC | MIR_call_op_error,
               "number of %s operands or results does not correspond to prototype %s",pcVar22,
               pMVar17->name);
LAB_001334e2:
    pcVar22 = "wrong number of call/unspec operands";
LAB_001334e9:
    MVar23 = MIR_ops_num_error;
  } while( true );
}

Assistant:

void MIR_append_insn (MIR_context_t ctx, MIR_item_t func_item, MIR_insn_t insn) {
  mir_assert (func_item != NULL);
  if (func_item->item_type != MIR_func_item)
    MIR_get_error_func (ctx) (MIR_wrong_param_value_error, "MIR_append_insn: wrong func item");
  DLIST_APPEND (MIR_insn_t, func_item->u.func->insns, insn);
}